

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImportBaseDirWrapper.cpp
# Opt level: O2

QString * __thiscall
ImportBaseFuncWrapper::getName(QString *__return_storage_ptr__,ImportBaseFuncWrapper *this)

{
  QString libName;
  QString functionName;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char16_t> local_58;
  QArrayDataPointer<char16_t> local_40;
  QArrayDataPointer<char16_t> local_28;
  
  getLibName((QString *)&local_70,this);
  getShortName((QString *)&local_58,this);
  if (local_70.size == 0) {
    QString::QString(__return_storage_ptr__,(QString *)&local_58);
  }
  else {
    local_88.d = local_70.d;
    local_88.ptr = local_70.ptr;
    local_88.size = local_70.size;
    if (local_70.d != (Data *)0x0) {
      LOCK();
      ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    operator+((QString *)&local_40,"[",(QString *)&local_88);
    operator+((QString *)&local_28,(QString *)&local_40,"].");
    operator+(__return_storage_ptr__,(QString *)&local_28,(QString *)&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_28);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  return __return_storage_ptr__;
}

Assistant:

QString ImportBaseFuncWrapper::getName()
{
    QString libName = getLibName();
    QString functionName = getShortName();

    if (!libName.length()) return functionName;

    return "[" + QString(libName) + "]." + functionName;
}